

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
::compute_higher_persistence
          (persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
           *this,unsigned_short min_dimension,unsigned_short max_dimension)

{
  bool bVar1;
  size_t sVar2;
  pair<float,_int> p;
  pair<int,_int> pVar3;
  ostream *poVar4;
  unsigned_long uVar5;
  int iVar6;
  ushort in_DX;
  ushort in_SI;
  undefined8 *in_RDI;
  pair<int,_int> betti;
  pivot_column_index_t pivot_column_index;
  index_t index;
  index_t number_of_cells;
  uint dimension;
  bool in_stack_000001b7;
  pivot_column_index_t *in_stack_000001b8;
  index_t in_stack_000001c4;
  persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  *in_stack_000001c8;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
  *in_stack_ffffffffffffff00;
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
  *in_stack_ffffffffffffff08;
  ulong in_stack_ffffffffffffff28;
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
  *in_stack_ffffffffffffff30;
  ostream *in_stack_ffffffffffffff38;
  persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  *in_stack_ffffffffffffff40;
  int local_7c;
  int iStack_78;
  filtration_index_t local_20;
  int local_18;
  int local_14;
  uint local_10;
  ushort local_c;
  ushort local_a;
  
  local_10 = 1;
  local_c = in_DX;
  local_a = in_SI;
  do {
    if (local_c < local_10) {
      return;
    }
    vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
    prepare_next_dimension(in_stack_ffffffffffffff30,(int)(in_stack_ffffffffffffff28 >> 0x20));
    if (local_10 + 1 == (uint)local_a) {
      sVar2 = vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
              number_of_cells(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      local_14 = (int)sVar2;
      for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
        vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
        filtration(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                   (index_t)in_stack_ffffffffffffff00);
        p = std::make_pair<float,int&>
                      ((float *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (int *)0x16467d);
        filtration_index_t::filtration_index_t(&local_20,p);
        std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::push_back
                  ((deque<filtration_index_t,_std::allocator<filtration_index_t>_> *)
                   in_stack_ffffffffffffff00,
                   (value_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      }
    }
    if ((uint)local_a <= local_10 + 1) {
      (**(code **)(*(long *)in_RDI[1] + 0x28))((long *)in_RDI[1],(undefined2)local_10);
      sort_columns(in_stack_ffffffffffffff40);
      fast_hash_map<int,_int>::fast_hash_map((fast_hash_map<int,_int> *)0x16471b);
      vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
      number_of_cells(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::reserve((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)in_stack_ffffffffffffff00,
                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      pVar3 = compute_pairs(in_stack_000001c8,in_stack_000001c4,in_stack_000001b8,in_stack_000001b7)
      ;
      iStack_78 = pVar3.second;
      if (local_10 < local_a) {
        if ((local_10 == local_a - 1) && ((*(byte *)((long)in_RDI + 0x24) & 1) != 0)) {
          in_stack_ffffffffffffff28 = in_RDI[3];
          uVar5 = std::numeric_limits<unsigned_long>::max();
          if (in_stack_ffffffffffffff28 < uVar5) {
            poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[K");
            poVar4 = std::operator<<(poVar4,"# Skipped columns in dimension ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
            in_stack_ffffffffffffff08 =
                 (vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                  *)std::operator<<(poVar4,": ");
            in_stack_ffffffffffffff00 =
                 (vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                  *)std::ostream::operator<<(in_stack_ffffffffffffff08,iStack_78);
            std::ostream::operator<<
                      (in_stack_ffffffffffffff00,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      else {
        local_7c = pVar3.first;
        vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
        computation_result((vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                            *)*in_RDI,local_10,(long)local_7c,(long)iStack_78);
        (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],(long)local_7c,(long)iStack_78);
        iVar6 = 1;
        if ((local_10 & 1) != 0) {
          iVar6 = -1;
        }
        *(int *)(in_RDI + 4) = iVar6 * local_7c + *(int *)(in_RDI + 4);
        if ((*(byte *)((long)in_RDI + 0x24) & 1) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[K");
          poVar4 = std::operator<<(poVar4,"dim H_");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
          in_stack_ffffffffffffff40 =
               (persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
                *)std::operator<<(poVar4," = ");
          std::ostream::operator<<(in_stack_ffffffffffffff40,local_7c);
          if (0 < iStack_78) {
            in_stack_ffffffffffffff38 = std::operator<<((ostream *)&std::cout," (skipped ");
            in_stack_ffffffffffffff30 =
                 (vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                  *)std::ostream::operator<<(in_stack_ffffffffffffff38,iStack_78);
            std::operator<<((ostream *)in_stack_ffffffffffffff30,")");
          }
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
      }
      if (local_10 < local_c) {
        assemble_columns_to_reduce
                  (in_stack_ffffffffffffff40,(index_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                   (pivot_column_index_t *)in_stack_ffffffffffffff30);
      }
      bVar1 = vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
              is_top_dimension((vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                                *)*in_RDI);
      in_stack_fffffffffffffefc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffefc);
      if (bVar1) {
        (**(code **)(*(long *)in_RDI[1] + 0x50))();
      }
      fast_hash_map<int,_int>::~fast_hash_map((fast_hash_map<int,_int> *)0x164a9f);
      if (bVar1) {
        return;
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void compute_higher_persistence(unsigned short min_dimension, unsigned short max_dimension) {
		for (auto dimension = 1u; dimension <= max_dimension; ++dimension) {
			complex.prepare_next_dimension(dimension);

			if (dimension + 1 == min_dimension) {
				// Here we need to reduce *all* cells because we did not compute anything of smaller dimension
				index_t number_of_cells = index_t(complex.number_of_cells(dimension));
				for (index_t index = 0; index < number_of_cells; index++) {
					columns_to_reduce.push_back(std::make_pair(complex.filtration(dimension, index), index));
				}
			}

			if (dimension + 1 < min_dimension) continue;

			output->computing_barcodes_in_dimension(dimension);

			sort_columns();

#ifdef INDICATE_PROGRESS
			std::cout << "\033[K"
			          << "computing persistent homology in dimension " << dimension << std::flush << "\r";
#endif
#ifdef USE_ARRAY_HASHMAP
			pivot_column_index_t pivot_column_index(complex.number_of_cells(dimension + 1), INVALID_INDEX);
#else
			pivot_column_index_t pivot_column_index;
			pivot_column_index.reserve(complex.number_of_cells(dimension + 1));
#endif

			auto betti = compute_pairs(dimension, pivot_column_index, dimension >= min_dimension);
			if (dimension >= min_dimension) {
				complex.computation_result(dimension, betti.first, betti.second);
#ifdef RETRIEVE_PERSISTENCE
				betti_numbers.push_back(betti.first);
#endif
				output->betti_number(betti.first, betti.second);
				euler_characteristic += (dimension & 1 ? -1 : 1) * betti.first;

				if (print_betti_numbers_to_console) {
					std::cout << "\033[K"
					          << "dim H_" << dimension << " = " << betti.first;
					if (betti.second > 0) { std::cout << " (skipped " << betti.second << ")"; }
					std::cout << std::endl;
				}
			} else if (int(dimension) == min_dimension - 1 && print_betti_numbers_to_console &&
			           max_entries < std::numeric_limits<size_t>::max()) {
				std::cout << "\033[K"
				          << "# Skipped columns in dimension " << dimension << ": " << betti.second << std::endl;
			}
			if (dimension < max_dimension) assemble_columns_to_reduce(dimension, pivot_column_index);

			// Stop early
			if (complex.is_top_dimension()) {
				output->remaining_homology_is_trivial();
				break;
			}
		}
	}